

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void disas_fp_compare(DisasContext_conflict1 *s,uint32_t insn)

{
  int size;
  
  if ((insn & 0xe000c007) != 0) {
    unallocated_encoding_aarch64(s);
    return;
  }
  switch(insn >> 0x16 & 3) {
  case 0:
    size = 2;
    break;
  case 1:
    size = 3;
    break;
  case 2:
switchD_006a5c5d_caseD_2:
    unallocated_encoding_aarch64(s);
    return;
  case 3:
    size = 1;
    if ((s->isar->id_aa64pfr0 & 0xf0000) != 0x10000) goto switchD_006a5c5d_caseD_2;
  }
  if (s->fp_access_checked == true) {
    __assert_fail("!s->fp_access_checked",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x487,"_Bool fp_access_check(DisasContext *)");
  }
  s->fp_access_checked = true;
  if (s->fp_excp_el != 0) {
    gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
    return;
  }
  handle_fp_compare(s,size,insn >> 5 & 0x1f,insn >> 0x10 & 0x1f,SUB41((insn & 8) >> 3,0),
                    SUB41((insn & 0x10) >> 4,0));
  return;
}

Assistant:

static void disas_fp_compare(DisasContext *s, uint32_t insn)
{
    unsigned int mos, type, rm, op, rn, opc, op2r;
    int size;

    mos = extract32(insn, 29, 3);
    type = extract32(insn, 22, 2);
    rm = extract32(insn, 16, 5);
    op = extract32(insn, 14, 2);
    rn = extract32(insn, 5, 5);
    opc = extract32(insn, 3, 2);
    op2r = extract32(insn, 0, 3);

    if (mos || op || op2r) {
        unallocated_encoding(s);
        return;
    }

    switch (type) {
    case 0:
        size = MO_32;
        break;
    case 1:
        size = MO_64;
        break;
    case 3:
        size = MO_16;
        if (dc_isar_feature(aa64_fp16, s)) {
            break;
        }
        /* fallthru */
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    handle_fp_compare(s, size, rn, rm, opc & 1, opc & 2);
}